

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void BrotliCalculateRingBufferSize(BrotliDecoderStateInternal *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = 1 << ((byte)s->window_bits & 0x1f);
  iVar3 = s->ringbuffer_size;
  iVar2 = 0x400;
  if (iVar3 != 0) {
    iVar2 = iVar3;
  }
  if ((iVar3 != iVar1) && ((*(ushort *)&s->field_0x13d0 & 4) == 0)) {
    if (s->ringbuffer == (uint8_t *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = s->pos;
    }
    iVar3 = iVar3 + s->meta_block_remaining_len;
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
    iVar2 = iVar1;
    if ((*(ushort *)&s->field_0x13d0 & 0x10) != 0) {
      do {
        iVar1 = iVar2;
        iVar2 = iVar1 >> 1;
      } while (iVar3 <= iVar1 >> 1);
    }
    s->new_ringbuffer_size = iVar1;
  }
  return;
}

Assistant:

static void BROTLI_NOINLINE BrotliCalculateRingBufferSize(
    BrotliDecoderState* s) {
  int window_size = 1 << s->window_bits;
  int new_ringbuffer_size = window_size;
  /* We need at least 2 bytes of ring buffer size to get the last two
     bytes for context from there */
  int min_size = s->ringbuffer_size ? s->ringbuffer_size : 1024;
  int output_size;

  /* If maximum is already reached, no further extension is retired. */
  if (s->ringbuffer_size == window_size) {
    return;
  }

  /* Metadata blocks does not touch ring buffer. */
  if (s->is_metadata) {
    return;
  }

  if (!s->ringbuffer) {
    output_size = 0;
  } else {
    output_size = s->pos;
  }
  output_size += s->meta_block_remaining_len;
  min_size = min_size < output_size ? output_size : min_size;

  if (!!s->canny_ringbuffer_allocation) {
    /* Reduce ring buffer size to save memory when server is unscrupulous.
       In worst case memory usage might be 1.5x bigger for a short period of
       ring buffer reallocation. */
    while ((new_ringbuffer_size >> 1) >= min_size) {
      new_ringbuffer_size >>= 1;
    }
  }

  s->new_ringbuffer_size = new_ringbuffer_size;
}